

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

_Bool binary_fuse16_deserialize(binary_fuse16_t *filter,char *buffer)

{
  char *__src;
  uint16_t *puVar1;
  char *in_RSI;
  binary_fuse16_t *in_RDI;
  bool bVar2;
  char *fingerprints;
  
  __src = binary_fuse16_deserialize_header(in_RDI,in_RSI);
  puVar1 = (uint16_t *)malloc((ulong)in_RDI->ArrayLength << 1);
  in_RDI->Fingerprints = puVar1;
  bVar2 = in_RDI->Fingerprints != (uint16_t *)0x0;
  if (bVar2) {
    memcpy(in_RDI->Fingerprints,__src,(ulong)in_RDI->ArrayLength << 1);
  }
  return bVar2;
}

Assistant:

static inline bool binary_fuse16_deserialize(binary_fuse16_t * filter, const char *buffer) {
  const char* fingerprints = binary_fuse16_deserialize_header(filter, buffer);
  filter->Fingerprints = (uint16_t*)malloc(filter->ArrayLength * sizeof(uint16_t));
  if(filter->Fingerprints == NULL) {
    return false;
  }
  memcpy(filter->Fingerprints, fingerprints, filter->ArrayLength * sizeof(uint16_t));
  return true;
}